

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O2

void __thiscall QFontDialogPrivate::updateSizes(QFontDialogPrivate *this)

{
  QWidget *this_00;
  QLineEdit *this_01;
  qsizetype qVar1;
  bool bVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QStyle *pQVar5;
  char16_t *pcVar6;
  int iVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QFontListView::currentText((QString *)&local_68,this->familyList);
  qVar1 = local_68.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if ((undefined1 *)qVar1 == (undefined1 *)0x0) {
    QLineEdit::clear(this->sizeEdit);
  }
  else {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFontListView::currentText((QString *)&local_88,this->familyList);
    QFontListView::currentText((QString *)&local_a0,this->styleList);
    QFontDatabase::pointSizes((QString *)&local_68,(QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    QList<QString>::reserve((QList<QString> *)&local_88,local_68.size);
    iVar7 = 0;
    iVar3 = -1;
    for (pcVar6 = local_68.ptr; pcVar6 != local_68.ptr + local_68.size * 2; pcVar6 = pcVar6 + 2) {
      QString::number((int)&local_a0,*(int *)pcVar6);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_88,(QString *)&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      if (iVar3 == -1) {
        iVar3 = -1;
        if (*(int *)pcVar6 == this->size) {
          iVar3 = iVar7;
        }
      }
      iVar7 = iVar7 + 1;
    }
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)this->sizeList);
    QStringListModel::setStringList((QList_conflict *)pQVar4);
    if (iVar3 != -1) {
      QFontListView::setCurrentItem(this->sizeList,iVar3);
    }
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_48,(QObject *)this->sizeEdit);
    this_01 = this->sizeEdit;
    if (this->smoothScalable == true) {
      QString::number((int)&local_a0,this->size);
    }
    else {
      QFontListView::currentText((QString *)&local_a0,this->sizeList);
    }
    QLineEdit::setText(this_01,(QString *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    pQVar5 = QWidget::style(this_00);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0xd,0,this_00,0);
    if (iVar3 != 0) {
      bVar2 = QWidget::hasFocus((QWidget *)this->sizeList);
      if (bVar2) {
        QLineEdit::selectAll(this->sizeEdit);
      }
    }
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_68);
  }
  updateSample(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::updateSizes()
{
    Q_Q(QFontDialog);

    if (!familyList->currentText().isEmpty()) {
        QList<int> sizes = QFontDatabase::pointSizes(familyList->currentText(), styleList->currentText());

        int i = 0;
        int current = -1;
        QStringList str_sizes;
        str_sizes.reserve(sizes.size());
        for(QList<int>::const_iterator it = sizes.constBegin(); it != sizes.constEnd(); ++it) {
            str_sizes.append(QString::number(*it));
            if (current == -1 && *it == size)
                current = i;
            ++i;
        }
        sizeList->model()->setStringList(str_sizes);
        if (current != -1)
            sizeList->setCurrentItem(current);

        const QSignalBlocker blocker(sizeEdit);
        sizeEdit->setText((smoothScalable ? QString::number(size) : sizeList->currentText()));
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && sizeList->hasFocus())
            sizeEdit->selectAll();
    } else {
        sizeEdit->clear();
    }

    updateSample();
}